

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O1

OPJ_BOOL opj_jp2_read_ftyp(opj_jp2_t *jp2,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                          opj_event_mgr_t *p_manager)

{
  uint uVar1;
  OPJ_UINT32 *pOVar2;
  char *fmt;
  ulong uVar3;
  long lVar4;
  
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0xa27,
                  "OPJ_BOOL opj_jp2_read_ftyp(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (jp2 == (opj_jp2_t *)0x0) {
    __assert_fail("jp2 != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0xa28,
                  "OPJ_BOOL opj_jp2_read_ftyp(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0xa29,
                  "OPJ_BOOL opj_jp2_read_ftyp(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (jp2->jp2_state == 1) {
    if (7 < p_header_size) {
      opj_read_bytes_LE(p_header_data,&jp2->brand,4);
      opj_read_bytes_LE(p_header_data + 4,&jp2->minversion,4);
      if ((p_header_size & 3) == 0) {
        uVar1 = p_header_size - 8 >> 2;
        jp2->numcl = uVar1;
        if (p_header_size - 8 != 0) {
          pOVar2 = (OPJ_UINT32 *)opj_calloc((ulong)uVar1,4);
          jp2->cl = pOVar2;
          if (pOVar2 == (OPJ_UINT32 *)0x0) {
            fmt = "Not enough memory with FTYP Box\n";
            goto LAB_00126d4c;
          }
        }
        if (jp2->numcl != 0) {
          lVar4 = 0;
          uVar3 = 0;
          do {
            opj_read_bytes_LE(p_header_data + lVar4 + 8,(OPJ_UINT32 *)((long)jp2->cl + lVar4),4);
            uVar3 = uVar3 + 1;
            lVar4 = lVar4 + 4;
          } while (uVar3 < jp2->numcl);
        }
        *(byte *)&jp2->jp2_state = (byte)jp2->jp2_state | 2;
        return 1;
      }
    }
    fmt = "Error with FTYP signature Box size\n";
  }
  else {
    fmt = "The ftyp box must be the second box in the file.\n";
  }
LAB_00126d4c:
  opj_event_msg(p_manager,1,fmt);
  return 0;
}

Assistant:

static OPJ_BOOL opj_jp2_read_ftyp(opj_jp2_t *jp2,
                                  OPJ_BYTE * p_header_data,
                                  OPJ_UINT32 p_header_size,
                                  opj_event_mgr_t * p_manager
                                 )
{
    OPJ_UINT32 i, l_remaining_bytes;

    /* preconditions */
    assert(p_header_data != 00);
    assert(jp2 != 00);
    assert(p_manager != 00);

    if (jp2->jp2_state != JP2_STATE_SIGNATURE) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "The ftyp box must be the second box in the file.\n");
        return OPJ_FALSE;
    }

    /* assure length of data is correct */
    if (p_header_size < 8) {
        opj_event_msg(p_manager, EVT_ERROR, "Error with FTYP signature Box size\n");
        return OPJ_FALSE;
    }

    opj_read_bytes(p_header_data, &jp2->brand, 4);      /* BR */
    p_header_data += 4;

    opj_read_bytes(p_header_data, &jp2->minversion, 4);     /* MinV */
    p_header_data += 4;

    l_remaining_bytes = p_header_size - 8;

    /* the number of remaining bytes should be a multiple of 4 */
    if ((l_remaining_bytes & 0x3) != 0) {
        opj_event_msg(p_manager, EVT_ERROR, "Error with FTYP signature Box size\n");
        return OPJ_FALSE;
    }

    /* div by 4 */
    jp2->numcl = l_remaining_bytes >> 2;
    if (jp2->numcl) {
        jp2->cl = (OPJ_UINT32 *) opj_calloc(jp2->numcl, sizeof(OPJ_UINT32));
        if (jp2->cl == 00) {
            opj_event_msg(p_manager, EVT_ERROR, "Not enough memory with FTYP Box\n");
            return OPJ_FALSE;
        }
    }

    for (i = 0; i < jp2->numcl; ++i) {
        opj_read_bytes(p_header_data, &jp2->cl[i], 4);      /* CLi */
        p_header_data += 4;
    }

    jp2->jp2_state |= JP2_STATE_FILE_TYPE;

    return OPJ_TRUE;
}